

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O3

void * mpp_dec_parser_thread(void *data)

{
  HalTaskInfo *task_00;
  MppDecImpl *dec;
  MppDecImpl *pMVar1;
  HalTaskGroup group;
  list_head *plVar2;
  MppPort port;
  Mpp *pMVar3;
  undefined4 index;
  MppBufferGroup *ppvVar4;
  undefined2 uVar5;
  ushort uVar6;
  MppThreadStatus MVar7;
  MPP_RET MVar8;
  uint uVar9;
  RK_S32 RVar10;
  RK_U32 RVar11;
  RK_U32 RVar12;
  MppFrameFormat MVar13;
  MppBuffer pvVar14;
  RK_S64 RVar15;
  size_t sVar16;
  void *pvVar17;
  list_head *plVar18;
  list_head *plVar19;
  DecTaskStatus DVar20;
  int iVar21;
  RK_U32 i;
  long lVar22;
  MppBufSlots pvVar23;
  MppBufferGroup group_00;
  MppThread *pMVar24;
  pthread_mutex_t *ppVar25;
  MppTask mpp_task;
  MppBuffer hal_buf_in;
  MppBuffer hal_buf_out;
  DecTask task;
  size_t in_stack_fffffffffffffe68;
  MppTask local_188;
  Mpp *local_180;
  MppBufSlots local_178;
  MppPacket local_170;
  MppBuffer local_168;
  MppThread *local_160;
  MppBuffer local_158;
  MppBufSlots local_150;
  DecTask local_148;
  MppBufferGroup *local_88;
  pthread_mutex_t *local_80;
  MppBufSlots local_78;
  MppDec local_70;
  MppBufSlots local_68;
  sem_t *local_60;
  pthread_mutex_t *local_58;
  sem_t *local_50;
  void **local_48;
  sem_t *local_40;
  pthread_cond_t *local_38;
  
  dec = *(MppDecImpl **)((long)data + 0xa8);
  pMVar24 = dec->thread_parser;
  local_68 = dec->packet_slots;
  local_180 = (Mpp *)data;
  dec_task_init(&local_148);
  mpp_clock_start(dec->clocks[0]);
  ppVar25 = (pthread_mutex_t *)pMVar24->mMutexCond;
  pthread_mutex_lock(ppVar25);
  MVar7 = MppThread::get_status(pMVar24,THREAD_WORK);
  if (MVar7 == MPP_THREAD_RUNNING) {
    local_38 = (pthread_cond_t *)&pMVar24->mMutexCond[0].mCondition;
    local_40 = (sem_t *)&dec->cmd_start;
    local_48 = &dec->param;
    local_50 = (sem_t *)&dec->cmd_done;
    local_58 = (pthread_mutex_t *)(pMVar24->mMutexCond + 3);
    local_60 = (sem_t *)&dec->parser_reset;
    local_88 = &local_180->mFrameGroup;
    local_160 = pMVar24;
    local_80 = ppVar25;
    do {
      MVar8 = check_task_wait(dec,&local_148);
      if (MVar8 != MPP_OK) {
        mpp_clock_start(dec->clocks[1]);
        MVar7 = pMVar24->mStatus[0];
        pMVar24->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_38,ppVar25);
        if (pMVar24->mStatus[0] == MPP_THREAD_WAITING) {
          pMVar24->mStatus[0] = MVar7;
        }
        mpp_clock_pause(dec->clocks[1]);
      }
      pthread_mutex_unlock(ppVar25);
      if (dec->cmd_send == dec->cmd_recv) {
        if (dec->reset_flag == 0) {
          mpp_clock_start(dec->clocks[2]);
          pMVar1 = (MppDecImpl *)local_180->mDec;
          local_150 = pMVar1->tasks;
          local_178 = pMVar1->frame_slots;
          pvVar23 = pMVar1->packet_slots;
          local_168 = (void *)0x0;
          local_158 = (void *)0x0;
          if (local_148.hnd == (HalTaskHnd)0x0) {
            hal_task_get_hnd(local_150,0,&local_148.hnd);
            if (local_148.hnd != (HalTaskHnd)0x0) {
              local_148.wait.val = local_148.wait.val & 0xfffffeff;
              goto LAB_00146b69;
            }
            local_148.wait.val = local_148.wait.val | 0x100;
          }
          else {
LAB_00146b69:
            if ((pMVar1->mpp_pkt_in == (MppPacket)0x0) && ((local_148.status.val & 0x100) == 0)) {
              port = local_180->mMppInPort;
              local_70 = local_180->mDec;
              local_188 = (MppBuffer)0x0;
              local_170 = (MppPacket)0x0;
              local_78 = pvVar23;
              MVar8 = _mpp_port_poll("try_get_input_packet",port,MPP_POLL_NON_BLOCK);
              if (MVar8 < MPP_OK) {
                local_148.wait.val = local_148.wait.val | 1;
                goto LAB_0014786e;
              }
              MVar8 = _mpp_port_dequeue("try_get_input_packet",port,&local_188);
              if (MVar8 != MPP_OK || local_188 == (MppBuffer)0x0) {
                in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x12a)
                ;
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "ret == MPP_OK && mpp_task","try_get_input_packet",
                           in_stack_fffffffffffffe68);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
              }
              mpp_task_meta_get_packet(local_188,KEY_INPUT_PACKET,&local_170);
              if (local_170 == (MppPacket)0x0) {
                in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),300);
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"packet",
                           "try_get_input_packet",in_stack_fffffffffffffe68);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
              }
              pvVar14 = mpp_packet_get_buffer(local_170);
              if (pvVar14 == (MppBuffer)0x0) {
                _mpp_port_enqueue("try_get_input_packet",port,local_188);
              }
              *(MppPacket *)((long)local_70 + 0x208) = local_170;
              local_180->mPacketGetCount = local_180->mPacketGetCount + 1;
              *(int *)((long)local_70 + 0x280) = *(int *)((long)local_70 + 0x280) + 1;
              local_148.status.val = local_148.status.val | 2;
              local_148.wait.val = local_148.wait.val & 0xfffffffe;
              if (pMVar1->mpp_pkt_in == (MppPacket)0x0) {
                in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x15c)
                ;
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "dec->mpp_pkt_in","try_proc_dec_task",in_stack_fffffffffffffe68);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
              }
              pvVar23 = local_78;
              if (((byte)mpp_dec_debug & 0x20) != 0) {
                RVar15 = mpp_packet_get_pts(pMVar1->mpp_pkt_in);
                in_stack_fffffffffffffe68 = mpp_packet_get_length(pMVar1->mpp_pkt_in);
                _mpp_log_l(4,"mpp_dec","detail: %p get pkt pts %llu len %d\n","try_proc_dec_task",
                           pMVar1,RVar15,in_stack_fffffffffffffe68);
              }
            }
            DVar20 = local_148.status;
            if ((local_148.status.val >> 8 & 1) == 0) {
              if (((byte)mpp_debug & 2) != 0) {
                RVar15 = mpp_packet_get_pts(pMVar1->mpp_pkt_in);
                _mpp_log_l(4,"mpp_dec","input packet pts %lld\n",(char *)0x0,RVar15);
              }
              mpp_clock_start(pMVar1->clocks[3]);
              mpp_parser_prepare(pMVar1->parser,pMVar1->mpp_pkt_in,&local_148.info.dec);
              mpp_clock_pause(pMVar1->clocks[3]);
              if (((pMVar1->cfg).base.sort_pts != 0) && (local_148.info.dec.valid != 0)) {
                local_148.ts_cur.pts = mpp_packet_get_pts(pMVar1->mpp_pkt_in);
                local_148.ts_cur.dts = mpp_packet_get_dts(pMVar1->mpp_pkt_in);
              }
              dec_release_input_packet(pMVar1,0);
              DVar20.val = local_148.status.val & 0xffff;
            }
            uVar6 = (ushort)((local_148.info.dec.valid & 1) << 8);
            local_148.status.val._0_2_ = (ushort)DVar20.val & 0xfeff | uVar6;
            if ((local_148.info.dec.valid == 0 & local_148.info._8_1_) == 1) {
              mpp_dec_put_task(local_180,&local_148);
              uVar6 = (ushort)local_148.status.val & 0x100;
            }
            if (uVar6 != 0) {
              if (local_148.info.dec.input_packet == (MppPacket)0x0) {
                in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x196)
                ;
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "task_dec->input_packet","try_proc_dec_task",in_stack_fffffffffffffe68);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
              }
              if (local_148.info.dec.input < 0) {
                mpp_buf_slot_get_unused(pvVar23,&local_148.info.dec.input);
              }
              local_148.wait.val._0_2_ =
                   (ushort)local_148.wait.val & 0xefff |
                   (ushort)((uint)local_148.info._44_4_ >> 0x13) & 0x1000;
              if (-1 < local_148.info.dec.input) {
                sVar16 = mpp_packet_get_size(local_148.info.dec.input_packet);
                mpp_buf_slot_get_prop(pvVar23,local_148.info.dec.input,SLOT_BUFFER,&local_168);
                pMVar24 = local_160;
                if (local_168 == (void *)0x0) {
                  mpp_buffer_get_with_tag
                            (local_180->mPacketGroup,&local_168,sVar16,"mpp_dec","try_proc_dec_task"
                            );
                  if (local_168 == (void *)0x0) {
                    local_148.wait.val = local_148.wait.val | 0x2000;
                    pMVar24 = local_160;
                    goto LAB_0014786e;
                  }
                  mpp_buf_slot_set_prop(pvVar23,local_148.info.dec.input,SLOT_BUFFER,local_168);
                  mpp_buffer_attach_dev_f("try_proc_dec_task",local_168,pMVar1->dev);
                  mpp_buffer_put_with_caller(local_168,"try_proc_dec_task");
                  pMVar24 = local_160;
                }
                else if (*(ulong *)((long)local_168 + 0x88) < sVar16) {
                  in_stack_fffffffffffffe68 =
                       CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x1b2);
                  _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "buf->info.size >= stream_size","try_proc_dec_task",
                             in_stack_fffffffffffffe68);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
                }
                local_148.wait.val._0_2_ =
                     (ushort)local_148.wait.val & 0xdfff | (ushort)(local_168 == (void *)0x0) << 0xd
                ;
                if (local_168 != (void *)0x0) {
                  uVar9 = local_148.status.val & 0xffff;
                  if ((local_148.status.val & 0x20) == 0) {
                    pvVar17 = mpp_packet_get_data(local_148.info.dec.input_packet);
                    sVar16 = mpp_packet_get_length(local_148.info.dec.input_packet);
                    mpp_buffer_write_with_caller(local_168,0,pvVar17,sVar16,"try_proc_dec_task");
                    pMVar24 = local_160;
                    mpp_buffer_sync_partial_end_f(local_168,0,0,(RK_U32)sVar16,"try_proc_dec_task");
                    mpp_buf_slot_set_flag(pvVar23,local_148.info.dec.input,SLOT_CODEC_READY);
                    mpp_buf_slot_set_flag(pvVar23,local_148.info.dec.input,SLOT_HAL_INPUT);
                    uVar9 = local_148.status.val | 0x20;
                    local_148.status.val._0_2_ = (short)uVar9;
                  }
                  if ((pMVar1->parser_fast_mode == 0) && ((uVar9 & 0x40) == 0)) {
                    local_188 = (HalTaskHnd)0x0;
                    hal_task_get_hnd(local_150,2,&local_188);
                    if (local_188 == (HalTaskHnd)0x0) {
                      local_148.wait.val = local_148.wait.val | 0x200;
                      goto LAB_0014786e;
                    }
                    local_148.status.val = local_148.status.val | 0x40;
                    local_148.wait.val = local_148.wait.val & 0xfffffdff;
                    hal_task_hnd_set_status(local_188,0);
                  }
                  if ((local_148.wait.val & 0x80) != 0) {
                    MVar8 = hal_task_check_empty(pMVar1->tasks,1);
                    if (MVar8 != MPP_OK) goto LAB_0014786e;
                    local_148.wait.val = local_148.wait.val & 0xffffff7f;
                  }
                  if (((byte)mpp_dec_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_dec","detail: %p check prev task pass\n","try_proc_dec_task",
                               pMVar1);
                  }
                  if (local_180->mFrmOut != (mpp_list *)0x0) {
                    RVar10 = mpp_list::list_size(local_180->mFrmOut);
                    local_148.wait.val._0_2_ =
                         ((ushort)local_148.wait.val & 0xfffd) + (ushort)(4 < RVar10) * 2;
                    if (4 < RVar10) goto LAB_0014786e;
                  }
                  if (((byte)mpp_dec_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_dec","detail: %p check mframes pass\n","try_proc_dec_task",
                               pMVar1);
                  }
                  RVar10 = mpp_slots_get_unused_count(local_178);
                  local_148.wait.val._0_2_ =
                       (ushort)local_148.wait.val & 0xbfff | (ushort)(RVar10 == 0) << 0xe;
                  if (RVar10 != 0) {
                    if ((local_148.status.val & 0x200) == 0) {
                      mpp_clock_start(pMVar1->clocks[4]);
                      mpp_parser_parse(pMVar1->parser,&local_148.info.dec);
                      mpp_clock_pause(pMVar1->clocks[4]);
                      local_148.status.val = local_148.status.val | 0x200;
                    }
                    if ((local_148.info.dec.output < 0) || (local_148.info.dec.valid == 0)) {
                      if (((ulong)local_148.info.dec.flags & 1) == 0) {
                        hal_task_hnd_set_status(local_148.hnd,0);
                        local_148.hnd = (HalTaskHnd)0x0;
                      }
                      else {
                        mpp_dec_put_task(local_180,&local_148);
                      }
                      uVar5 = local_148.status.val._0_2_;
                      if ((local_148.status.val & 0x20) != 0) {
                        mpp_buf_slot_clr_flag(pvVar23,local_148.info.dec.input,SLOT_HAL_INPUT);
                        uVar5 = local_148.status.val._0_2_ & 0xffdf;
                      }
                      local_148.status.val = CONCAT22(local_148.status.val._2_2_,uVar5) & 0xfffffcff
                      ;
                      dec_task_info_init(&local_148.info);
                    }
                    else {
                      if (((byte)mpp_dec_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_dec","detail: %p check output index pass\n",
                                   "try_proc_dec_task",pMVar1);
                      }
                      RVar11 = mpp_buf_slot_is_changed(local_178);
                      if (RVar11 != 0) {
                        if ((local_148.status.val & 0x80) == 0) {
                          uVar9 = local_148.info._8_4_;
                          local_148.info.dec.flags =
                               (HalDecTaskFlag)
                               ((ulong)local_148.info.dec.flags & 0xfffffffffffffffc | 2);
                          mpp_dec_put_task(local_180,&local_148);
                          local_148.info.dec.flags =
                               (HalDecTaskFlag)
                               ((ulong)local_148.info.dec.flags & 0xfffffffffffffffe |
                               (ulong)(uVar9 & 1));
                          local_148.status.val = local_148.status.val | 0x80;
                          goto LAB_0014786e;
                        }
                        pMVar1->info_updated = 0;
                      }
                      RVar11 = mpp_buf_slot_is_changed(local_178);
                      local_148.wait.val._0_2_ =
                           (ushort)local_148.wait.val & 0xffdf | (ushort)((RVar11 & 1) << 5);
                      if ((RVar11 & 1) == 0) {
                        local_148.status.val = local_148.status.val & 0xffffff7f;
                        local_148.info._8_8_ = local_148.info._8_8_ & 0xfffffffffffffffd;
                        if (local_148.hnd == (HalTaskHnd)0x0) {
                          in_stack_fffffffffffffe68 =
                               CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x23a);
                          _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                                     "task->hnd","try_proc_dec_task",in_stack_fffffffffffffe68);
                          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
                        }
                        group_00 = *local_88;
                        if (group_00 == (MppBufferGroup)0x0) {
                          _mpp_log_l(4,"mpp_dec","mpp_dec use internal frame buffer group\n",
                                     (char *)0x0);
                          ppvVar4 = local_88;
                          mpp_buffer_group_get
                                    (local_88,0x20001,MPP_BUFFER_INTERNAL,"mpp_dec",
                                     "try_proc_dec_task");
                          group_00 = *ppvVar4;
                          if (group_00 != (MppBufferGroup)0x0) goto LAB_00147477;
                        }
                        else {
LAB_00147477:
                          RVar10 = mpp_buffer_group_unused(group_00);
                          iVar21 = (uint)(pMVar1->vproc != (void *)0x0) * 2 + 1;
                          local_148.wait.val._0_2_ =
                               (ushort)local_148.wait.val & 0xffbf | (ushort)(RVar10 < iVar21) << 6;
                          if (RVar10 < iVar21) goto LAB_0014786e;
                        }
                        if (((byte)mpp_dec_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_dec","detail: %p check frame group count pass\n",
                                     "try_proc_dec_task",pMVar1);
                        }
                        index = local_148.info.dec.output;
                        mpp_buf_slot_get_prop
                                  (local_178,local_148.info.dec.output,SLOT_BUFFER,&local_158);
                        pvVar23 = local_178;
                        if (local_158 == (void *)0x0) {
                          local_188 = (MppFrame)0x0;
                          mpp_buf_slot_get_prop(local_178,index,SLOT_FRAME_PTR,&local_188);
                          sVar16 = mpp_buf_slot_get_size(pvVar23);
                          if ((local_188 != (MppFrame)0x0) &&
                             (RVar11 = mpp_frame_get_thumbnail_en(local_188), RVar11 == 2)) {
                            RVar11 = mpp_frame_get_width(local_188);
                            RVar12 = mpp_frame_get_height(local_188);
                            sVar16 = (size_t)((RVar12 >> 1) * (RVar11 >> 1) * 3 >> 1);
                          }
                          mpp_buffer_get_with_tag
                                    (*local_88,&local_158,sVar16,"mpp_dec","try_proc_dec_task");
                          pMVar24 = local_160;
                          if (local_158 != (void *)0x0) {
                            mpp_buf_slot_set_prop(local_178,index,SLOT_BUFFER,local_158);
                            pMVar24 = local_160;
                          }
                        }
                        if (((byte)mpp_dec_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_dec","detail: %p check output buffer %p\n",
                                     "try_proc_dec_task",pMVar1,local_158);
                        }
                        local_188 = (MppFrame)0x0;
                        mpp_buf_slot_get_prop(local_178,index,SLOT_FRAME_PTR,&local_188);
                        MVar13 = mpp_frame_get_fmt(local_188);
                        if (((MVar13 & 0xc000000) != MPP_FMT_YUV420SP) &&
                           ((pMVar1->cfg).base.enable_hdr_meta != 0)) {
                          fill_hdr_meta_to_frame(local_188,pMVar1->coding);
                        }
                        if ((pMVar1->info_updated == 0) && (pMVar1->dev != (MppDev)0x0)) {
                          local_188 = (MppFrame)0x0;
                          mpp_buf_slot_get_prop(local_178,index,SLOT_FRAME_PTR,&local_188);
                          update_dec_hal_info(pMVar1,local_188);
                          pMVar1->info_updated = 1;
                        }
                        local_148.wait.val._0_2_ =
                             (ushort)local_148.wait.val & 0xfbff |
                             (ushort)(local_158 == (void *)0x0) << 10;
                        if (local_158 != (void *)0x0) {
                          if ((pMVar1->cfg).base.sort_pts != 0) {
                            local_188 = (MppBuffer)0x0;
                            plVar18 = (list_head *)
                                      mpp_mem_pool_get_f("try_proc_dec_task",pMVar1->ts_pool);
                            if (plVar18 == (list_head *)0x0) {
                              in_stack_fffffffffffffe68 =
                                   CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x28d);
                              _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                                         "pkt_ts","try_proc_dec_task",in_stack_fffffffffffffe68);
                              if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00147975:
                                abort();
                              }
                            }
                            mpp_buf_slot_get_prop(local_178,index,SLOT_FRAME_PTR,&local_188);
                            plVar18[1].next = (list_head *)local_148.ts_cur.pts;
                            plVar18[1].prev = (list_head *)local_148.ts_cur.dts;
                            plVar18->next = plVar18;
                            plVar18->prev = plVar18;
                            pMVar24 = local_160;
                            if ((local_188 != (MppFrame)0x0) &&
                               (plVar19 = (list_head *)mpp_frame_get_pts(local_188),
                               pMVar24 = local_160, plVar19 == plVar18[1].next)) {
                              mpp_spinlock_lock(&pMVar1->ts_lock);
                              plVar19 = (pMVar1->ts_link).prev;
                              (pMVar1->ts_link).prev = plVar18;
                              plVar18->next = &pMVar1->ts_link;
                              plVar18->prev = plVar19;
                              plVar19->next = plVar18;
                              list_sort((void *)0x0,&pMVar1->ts_link,ts_cmp);
                              mpp_spinlock_unlock(&pMVar1->ts_lock);
                              pMVar24 = local_160;
                            }
                          }
                          mpp_clock_start(pMVar1->clocks[5]);
                          task_00 = &local_148.info;
                          mpp_hal_reg_gen(pMVar1->hal,task_00);
                          mpp_clock_pause(pMVar1->clocks[5]);
                          mpp_clock_start(pMVar1->clocks[6]);
                          mpp_hal_hw_start(pMVar1->hal,task_00);
                          mpp_clock_pause(pMVar1->clocks[6]);
                          mpp_dec_put_task(local_180,&local_148);
                          uVar6 = (ushort)((local_148.info._8_4_ & 0x20) << 2);
                          if (pMVar1->parser_fast_mode == 0) {
                            uVar6 = 0;
                          }
                          local_148.wait.val._0_2_ = (ushort)local_148.wait.val & 0xff7f | uVar6;
                          local_148.status.val = local_148.status.val & 0xfffffc9f;
                          dec_task_info_init(task_00);
                          if (((byte)mpp_dec_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_dec","detail: %p one task ready\n","try_proc_dec_task"
                                       ,pMVar1);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0014786e:
          mpp_clock_pause(dec->clocks[2]);
          ppVar25 = local_80;
        }
        else {
          pMVar1 = (MppDecImpl *)local_180->mDec;
          pMVar24 = pMVar1->thread_hal;
          pvVar23 = pMVar1->frame_slots;
          group = pMVar1->tasks;
          local_150 = pMVar1->packet_slots;
          if ((((byte)mpp_dec_debug & 0x40) != 0) &&
             (_mpp_log_l(4,"mpp_dec","reset: parser reset start\n",(char *)0x0),
             ((byte)mpp_dec_debug & 0x40) != 0)) {
            _mpp_log_l(4,"mpp_dec","reset: parser wait hal proc reset start\n",(char *)0x0);
          }
          dec_release_task_in_port(local_180->mMppInPort);
          if (pMVar24 == (MppThread *)0x0) {
            in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x94);
            _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
                       "reset_parser_thread",in_stack_fffffffffffffe68);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147975;
          }
          pthread_mutex_lock((pthread_mutex_t *)pMVar24->mMutexCond);
          pMVar1->hal_reset_post = pMVar1->hal_reset_post + 1;
          pthread_cond_signal((pthread_cond_t *)&pMVar24->mMutexCond[0].mCondition);
          pthread_mutex_unlock((pthread_mutex_t *)pMVar24->mMutexCond);
          sem_wait((sem_t *)&pMVar1->hal_reset);
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser check hal proc task empty start\n",(char *)0x0);
          }
          MVar8 = hal_task_check_empty(group,1);
          if ((MVar8 != MPP_OK) &&
             (_mpp_log_l(2,"mpp_dec","found task not processed put %d get %d\n",
                         "reset_parser_thread",(ulong)local_180->mTaskPutCount,
                         (ulong)local_180->mTaskGetCount), (mpp_debug._3_1_ & 0x10) != 0))
          goto LAB_00147975;
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser check hal proc task empty done\n",(char *)0x0);
          }
          local_148.status.val = local_148.status.val & 0xfffffebf | 0x40;
          local_148.info.dec.valid = 0;
          mpp_parser_reset(pMVar1->parser);
          mpp_hal_reset(pMVar1->hal);
          pvVar17 = pMVar1->vproc;
          if (pvVar17 != (void *)0x0) {
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: vproc reset start\n",(char *)0x0);
              pvVar17 = pMVar1->vproc;
            }
            dec_vproc_reset(pvVar17);
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: vproc reset done\n",(char *)0x0);
            }
          }
          if ((local_148.status.val & 0x200) != 0) {
            _mpp_log_l(4,"mpp_dec","task no send to hal que must clr current frame hal status\n",
                       (char *)0x0);
            if (-1 < local_148.info.dec.output) {
              mpp_buf_slot_clr_flag(pvVar23,local_148.info.dec.output,SLOT_HAL_OUTPUT);
            }
            lVar22 = 0;
            do {
              RVar10 = *(RK_S32 *)((long)&local_148.info + lVar22 * 4 + 0x38);
              if (-1 < RVar10) {
                mpp_buf_slot_clr_flag(pvVar23,RVar10,SLOT_HAL_INPUT);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0x11);
            local_170 = (MppPacket)CONCAT44(local_170._4_4_,RVar10);
            local_148.status.val = local_148.status.val & 0xfffffdff;
          }
          dec_release_input_packet(pMVar1,1);
          while (MVar8 = mpp_buf_slot_dequeue(pvVar23,(RK_S32 *)&local_170,QUEUE_DISPLAY),
                MVar8 == MPP_OK) {
            local_188 = (MppBuffer)0x0;
            mpp_buf_slot_get_prop(pvVar23,(RK_S32)local_170,SLOT_BUFFER,&local_188);
            if (local_188 != (MppBuffer)0x0) {
              mpp_buffer_put_with_caller(local_188,"reset_parser_thread");
            }
            mpp_buf_slot_clr_flag(pvVar23,(RK_S32)local_170,SLOT_QUEUE_USE);
          }
          if ((pMVar1->cfg).base.sort_pts != 0) {
            mpp_spinlock_lock(&pMVar1->ts_lock);
            plVar18 = (pMVar1->ts_link).next;
            while (plVar18 != &pMVar1->ts_link) {
              plVar19 = plVar18->next;
              plVar2 = plVar18->prev;
              plVar19->prev = plVar2;
              plVar2->next = plVar19;
              plVar18->next = plVar18;
              plVar18->prev = plVar18;
              mpp_mem_pool_put_f("reset_parser_thread",pMVar1->ts_pool,plVar18);
              plVar18 = plVar19;
            }
            mpp_spinlock_unlock(&pMVar1->ts_lock);
          }
          uVar5 = local_148.status.val._0_2_;
          if ((local_148.status.val & 0x20) != 0) {
            mpp_buf_slot_clr_flag(local_150,local_148.info.dec.input,SLOT_HAL_INPUT);
            uVar5 = local_148.status.val._0_2_ & 0xffdf;
            local_148.status.val = local_148.status.val & 0xffffffdf;
            local_148.info.dec.input = -1;
          }
          pMVar24 = local_160;
          if ((local_148.wait.val & 0x20) != 0) {
            _mpp_log_l(4,"mpp_dec","reset at info change\n",(char *)0x0);
            uVar5 = local_148.status.val._0_2_;
          }
          local_148.status.val = CONCAT22(local_148.status.val._2_2_,uVar5) & 0xfffffdff;
          pMVar1->parser_status_flag = 0;
          pMVar1->parser_wait_flag = 0;
          dec_task_init(&local_148);
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser reset all done\n",(char *)0x0);
          }
          ppVar25 = local_58;
          pthread_mutex_lock(local_58);
          dec->reset_flag = 0;
          sem_post(local_60);
          pthread_mutex_unlock(ppVar25);
          ppVar25 = local_80;
        }
      }
      else {
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_parser_thread",
                     (ulong)dec->cmd_recv,(ulong)dec->cmd);
        }
        sem_wait(local_40);
        MVar8 = mpp_dec_proc_cfg(dec,dec->cmd,dec->param);
        *dec->cmd_ret = MVar8;
        uVar9 = dec->cmd_recv + 1;
        dec->cmd_recv = uVar9;
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_parser_thread",(ulong)uVar9,
                     (ulong)dec->cmd_send);
        }
        dec->cmd = 0;
        *local_48 = (void *)0x0;
        local_48[1] = (MPP_RET *)0x0;
        sem_post(local_50);
      }
      pthread_mutex_lock(ppVar25);
      MVar7 = MppThread::get_status(pMVar24,THREAD_WORK);
    } while (MVar7 == MPP_THREAD_RUNNING);
  }
  pthread_mutex_unlock(ppVar25);
  mpp_clock_pause(dec->clocks[0]);
  if (((byte)mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread is going to exit\n",(char *)0x0);
  }
  pvVar23 = local_68;
  if ((local_148.hnd != (HalTaskHnd)0x0) && (local_148.info.dec.valid != 0)) {
    mpp_buf_slot_set_flag(local_68,local_148.info.dec.input,SLOT_CODEC_READY);
    mpp_buf_slot_set_flag(pvVar23,local_148.info.dec.input,SLOT_HAL_INPUT);
    mpp_buf_slot_clr_flag(pvVar23,local_148.info.dec.input,SLOT_HAL_INPUT);
  }
  pMVar3 = local_180;
  mpp_buffer_group_clear(local_180->mPacketGroup);
  dec_release_task_in_port(pMVar3->mMppInPort);
  if (((byte)mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread exited\n",(char *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *mpp_dec_parser_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *parser = dec->thread_parser;
    MppBufSlots packet_slots = dec->packet_slots;

    DecTask task;
    HalDecTask  *task_dec = &task.info.dec;

    dec_task_init(&task);

    mpp_clock_start(dec->clocks[DEC_PRS_TOTAL]);

    while (1) {
        {
            AutoMutex autolock(parser->mutex());
            if (MPP_THREAD_RUNNING != parser->get_status())
                break;

            /*
             * parser thread need to wait at cases below:
             * 1. no task slot for output
             * 2. no packet for parsing
             * 3. info change on progress
             * 3. no buffer on analyzing output task
             */
            if (check_task_wait(dec, &task)) {
                mpp_clock_start(dec->clocks[DEC_PRS_WAIT]);
                parser->wait();
                mpp_clock_pause(dec->clocks[DEC_PRS_WAIT]);
            }
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        if (dec->reset_flag) {
            reset_parser_thread(mpp, &task);

            AutoMutex autolock(parser->mutex(THREAD_CONTROL));
            dec->reset_flag = 0;
            sem_post(&dec->parser_reset);
            continue;
        }

        // NOTE: ignore return value here is to fast response to reset.
        // Otherwise we can loop all dec task until it is failed.
        mpp_clock_start(dec->clocks[DEC_PRS_PROC]);
        try_proc_dec_task(mpp, &task);
        mpp_clock_pause(dec->clocks[DEC_PRS_PROC]);
    }

    mpp_clock_pause(dec->clocks[DEC_PRS_TOTAL]);

    mpp_dbg_info("mpp_dec_parser_thread is going to exit\n");
    if (task.hnd && task_dec->valid) {
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
        mpp_buf_slot_clr_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
    }
    mpp_buffer_group_clear(mpp->mPacketGroup);
    dec_release_task_in_port(mpp->mMppInPort);
    mpp_dbg_info("mpp_dec_parser_thread exited\n");
    return NULL;
}